

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.cpp
# Opt level: O0

void __thiscall
hungarian_algorithm::HungarianSolverBase::HungarianSolverBase
          (HungarianSolverBase *this,size_t num_rows,size_t num_cols)

{
  size_type sVar1;
  size_t sVar2;
  size_t sVar3;
  allocator<bool> local_3c;
  bool local_3b;
  allocator<bool> local_3a;
  bool local_39;
  allocator<bool> local_38;
  bool local_37;
  allocator<bool> local_36;
  bool local_35 [19];
  allocator<bool> local_22;
  bool local_21;
  size_t local_20;
  size_t num_cols_local;
  size_t num_rows_local;
  HungarianSolverBase *this_local;
  
  this->num_rows_ = num_rows;
  this->num_cols_ = num_cols;
  sVar1 = this->num_rows_;
  local_21 = false;
  local_20 = num_cols;
  num_cols_local = num_rows;
  num_rows_local = (size_t)this;
  std::allocator<bool>::allocator(&local_22);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->covered_rows_,sVar1,&local_21,&local_22);
  std::allocator<bool>::~allocator(&local_22);
  sVar1 = this->num_cols_;
  local_35[0] = false;
  std::allocator<bool>::allocator(&local_36);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->covered_cols_,sVar1,local_35,&local_36);
  std::allocator<bool>::~allocator(&local_36);
  sVar2 = this->num_rows_;
  sVar3 = this->num_cols_;
  local_37 = false;
  std::allocator<bool>::allocator(&local_38);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->zero_matrix_,sVar2 * sVar3,&local_37,&local_38);
  std::allocator<bool>::~allocator(&local_38);
  sVar2 = this->num_rows_;
  sVar3 = this->num_cols_;
  local_39 = false;
  std::allocator<bool>::allocator(&local_3a);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->star_matrix_,sVar2 * sVar3,&local_39,&local_3a);
  std::allocator<bool>::~allocator(&local_3a);
  sVar2 = this->num_rows_;
  sVar3 = this->num_cols_;
  local_3b = false;
  std::allocator<bool>::allocator(&local_3c);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->prime_matrix_,sVar2 * sVar3,&local_3b,&local_3c);
  std::allocator<bool>::~allocator(&local_3c);
  return;
}

Assistant:

HungarianSolverBase::HungarianSolverBase(const std::size_t num_rows, const std::size_t num_cols)
  : num_rows_(static_cast<std::size_t>(num_rows)), num_cols_(static_cast<std::size_t>(num_cols)),
    covered_rows_(num_rows_, false), covered_cols_(num_cols_, false), zero_matrix_(num_rows_ * num_cols_, false),
    star_matrix_(num_rows_ * num_cols_, false), prime_matrix_(num_rows_ * num_cols_, false)
{
}